

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matsolve.c
# Opt level: O0

MATRIX mat_backsubs1(MATRIX A,MATRIX B,MATRIX X,MATRIX P,int xcol)

{
  int iVar1;
  double sum;
  int n;
  int k;
  int j;
  int i;
  int xcol_local;
  MATRIX P_local;
  MATRIX X_local;
  MATRIX B_local;
  MATRIX A_local;
  
  iVar1 = *(int *)((long)A + -4);
  for (k = 0; i = k, k < iVar1; k = k + 1) {
    while (i = i + 1, i < iVar1) {
      *B[(int)*P[i]] = -A[(int)*P[i]][k] * *B[(int)*P[k]] + *B[(int)*P[i]];
    }
  }
  X[iVar1 + -1][xcol] = *B[(int)*P[iVar1 + -1]] / A[(int)*P[iVar1 + -1]][iVar1 + -1];
  for (k = iVar1 + -2; -1 < k; k = k + -1) {
    sum = 0.0;
    j = k;
    while (j = j + 1, j < iVar1) {
      sum = A[(int)*P[k]][j] * X[j][xcol] + sum;
    }
    X[k][xcol] = (*B[(int)*P[k]] - sum) / A[(int)*P[k]][k];
  }
  return X;
}

Assistant:

MATRIX mat_backsubs1( MATRIX A, MATRIX B, MATRIX X, MATRIX P, int xcol )
{
	int	i, j, k, n;
	double	sum;

	n = MatCol(A);

	for (k=0; k<n; k++)
		{
		for (i=k+1; i<n; i++)
			B[(int)P[i][0]][0] -= A[(int)P[i][0]][k] * B[(int)P[k][0]][0];
		}

	X[n-1][xcol] = B[(int)P[n-1][0]][0] / A[(int)P[n-1][0]][n-1];
	for (k=n-2; k>=0; k--)
		{
		sum = 0.0;
		for (j=k+1; j<n; j++)
			{
			sum += A[(int)P[k][0]][j] * X[j][xcol];
			}
		X[k][xcol] = (B[(int)P[k][0]][0] - sum) / A[(int)P[k][0]][k];
		}

	return (X);
}